

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrect.cpp
# Opt level: O0

VRect __thiscall VRect::operator&(VRect *this,VRect *r)

{
  VRect VVar1;
  bool bVar2;
  int *piVar3;
  int *in_RSI;
  VRect *in_RDI;
  int b2;
  int t2;
  int b1;
  int t1;
  int r2;
  int l2;
  int r1;
  int l1;
  VRect tmp;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  VRect local_10;
  
  local_20 = in_RSI;
  bVar2 = empty(in_RDI);
  if (bVar2) {
    memset(&local_10,0,0x10);
    VRect(&local_10);
  }
  else {
    local_24 = in_RDI->x1;
    local_28 = in_RDI->x1;
    if ((in_RDI->x2 - in_RDI->x1) + 1 < 0) {
      local_24 = in_RDI->x2;
    }
    else {
      local_28 = in_RDI->x2;
    }
    local_2c = *local_20;
    local_30 = *local_20;
    if ((local_20[2] - *local_20) + 1 < 0) {
      local_2c = local_20[2];
    }
    else {
      local_30 = local_20[2];
    }
    if ((local_30 < local_24) || (local_28 < local_2c)) {
      memset(&local_10,0,0x10);
      VRect(&local_10);
    }
    else {
      local_34 = in_RDI->y1;
      local_38 = in_RDI->y1;
      if ((in_RDI->y2 - in_RDI->y1) + 1 < 0) {
        local_34 = in_RDI->y2;
      }
      else {
        local_38 = in_RDI->y2;
      }
      local_3c = local_20[1];
      local_40 = local_20[1];
      if ((local_20[3] - local_20[1]) + 1 < 0) {
        local_3c = local_20[3];
      }
      else {
        local_40 = local_20[3];
      }
      if ((local_40 < local_34) || (local_38 < local_3c)) {
        memset(&local_10,0,0x10);
        VRect(&local_10);
      }
      else {
        VRect(&local_10);
        piVar3 = std::max<int>(&local_24,&local_2c);
        local_10.x1 = *piVar3;
        piVar3 = std::min<int>(&local_28,&local_30);
        local_10.x2 = *piVar3;
        piVar3 = std::max<int>(&local_34,&local_3c);
        local_10.y1 = *piVar3;
        piVar3 = std::min<int>(&local_38,&local_40);
        local_10.y2 = *piVar3;
      }
    }
  }
  VVar1.y1 = local_10.y1;
  VVar1.x1 = local_10.x1;
  VVar1.x2 = local_10.x2;
  VVar1.y2 = local_10.y2;
  return VVar1;
}

Assistant:

VRect VRect::operator&(const VRect &r) const
{
    if (empty()) return VRect();

    int l1 = x1;
    int r1 = x1;
    if (x2 - x1 + 1 < 0)
        l1 = x2;
    else
        r1 = x2;

    int l2 = r.x1;
    int r2 = r.x1;
    if (r.x2 - r.x1 + 1 < 0)
        l2 = r.x2;
    else
        r2 = r.x2;

    if (l1 > r2 || l2 > r1) return VRect();

    int t1 = y1;
    int b1 = y1;
    if (y2 - y1 + 1 < 0)
        t1 = y2;
    else
        b1 = y2;

    int t2 = r.y1;
    int b2 = r.y1;
    if (r.y2 - r.y1 + 1 < 0)
        t2 = r.y2;
    else
        b2 = r.y2;

    if (t1 > b2 || t2 > b1) return VRect();

    VRect tmp;
    tmp.x1 = std::max(l1, l2);
    tmp.x2 = std::min(r1, r2);
    tmp.y1 = std::max(t1, t2);
    tmp.y2 = std::min(b1, b2);
    return tmp;
}